

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_mbmi_b(AV1_COMP *cpi,ThreadData_conflict *td,aom_writer *w)

{
  int iVar1;
  MACROBLOCKD *in_RDX;
  AV1_COMMON *in_RSI;
  aom_writer *in_RDI;
  MB_MODE_INFO_EXT_FRAME *unaff_retaddr;
  MB_MODE_INFO *m;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  aom_writer *in_stack_00000070;
  ThreadData_conflict *in_stack_00000078;
  AV1_COMP *in_stack_00000080;
  od_ec_enc *cm_00;
  
  cm_00 = &in_RDI[0x1122].ec;
  iVar1 = frame_is_intra_only((AV1_COMMON *)cm_00);
  if (iVar1 == 0) {
    set_ref_ptrs(in_RSI,in_RDX,(MV_REFERENCE_FRAME)((ulong)cm_00 >> 0x38),
                 (MV_REFERENCE_FRAME)((ulong)cm_00 >> 0x30));
    pack_inter_mode_mvs(in_stack_00000080,in_stack_00000078,in_stack_00000070);
  }
  else {
    write_mb_modes_kf((AV1_COMP *)xd,(MACROBLOCKD *)m,unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

static inline void write_mbmi_b(AV1_COMP *cpi, ThreadData *const td,
                                aom_writer *w) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &td->mb.e_mbd;
  MB_MODE_INFO *m = xd->mi[0];

  if (frame_is_intra_only(cm)) {
    write_mb_modes_kf(cpi, xd, td->mb.mbmi_ext_frame, w);
  } else {
    // has_subpel_mv_component needs the ref frame buffers set up to look
    // up if they are scaled. has_subpel_mv_component is in turn needed by
    // write_switchable_interp_filter, which is called by pack_inter_mode_mvs.
    set_ref_ptrs(cm, xd, m->ref_frame[0], m->ref_frame[1]);

#if ENC_MISMATCH_DEBUG
    enc_dump_logs(cm, &cpi->mbmi_ext_info, xd->mi_row, xd->mi_col);
#endif  // ENC_MISMATCH_DEBUG

    pack_inter_mode_mvs(cpi, td, w);
  }
}